

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall
cmGeneratorTarget::ComputeOutputDir
          (cmGeneratorTarget *this,string *config,ArtifactType artifact,string *out)

{
  TargetType TVar1;
  size_type sVar2;
  cmGlobalGenerator *pcVar3;
  cmMakefile *pcVar4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  string *in_base;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  string suffix;
  cmGeneratorExpression ge;
  string conf;
  string configPropStr;
  string propertyNameStr;
  string targetTypeName;
  string configUpper;
  undefined1 local_140 [8];
  string local_138;
  cmGeneratorExpression local_118 [2];
  string local_f8;
  char *local_d8;
  long local_d0;
  char *local_b8;
  long local_b0;
  cmListFileBacktrace local_98;
  cmListFileBacktrace local_88;
  string local_70 [32];
  string local_50;
  
  std::__cxx11::string::string((string *)&local_f8,(string *)config);
  pcVar7 = GetOutputTargetType(this,artifact);
  std::__cxx11::string::string<std::allocator<char>>(local_70,pcVar7,(allocator<char> *)&local_b8);
  std::__cxx11::string::string((string *)&local_b8,local_70);
  if (local_b0 == 0) {
    pcVar7 = (char *)0x0;
  }
  else {
    std::__cxx11::string::append((char *)&local_b8);
    pcVar7 = local_b8;
  }
  cmsys::SystemTools::UpperCase(&local_50,&local_f8);
  std::__cxx11::string::string((string *)&local_d8,local_70);
  if (local_d0 == 0) {
    local_d8 = (char *)0x0;
  }
  else {
    std::__cxx11::string::append((char *)&local_d8);
    std::__cxx11::string::append((string *)&local_d8);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_140 + 8),local_d8,(allocator<char> *)local_118);
  pcVar8 = GetProperty(this,(string *)(local_140 + 8));
  std::__cxx11::string::~string((string *)(local_140 + 8));
  if (pcVar8 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_140 + 8),pcVar7,(allocator<char> *)local_118);
    pcVar7 = GetProperty(this,(string *)(local_140 + 8));
    std::__cxx11::string::~string((string *)(local_140 + 8));
    if (pcVar7 == (char *)0x0) {
      TVar1 = this->Target->TargetTypeValue;
      if (TVar1 - STATIC_LIBRARY < 3) {
        pcVar4 = this->Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(local_140 + 8),"LIBRARY_OUTPUT_PATH",(allocator<char> *)local_118);
        cmMakefile::GetSafeDefinition(pcVar4,(string *)(local_140 + 8));
        std::__cxx11::string::_M_assign((string *)out);
      }
      else {
        if (TVar1 != EXECUTABLE) goto LAB_002ac463;
        pcVar4 = this->Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(local_140 + 8),"EXECUTABLE_OUTPUT_PATH",(allocator<char> *)local_118);
        cmMakefile::GetSafeDefinition(pcVar4,(string *)(local_140 + 8));
        std::__cxx11::string::_M_assign((string *)out);
      }
      std::__cxx11::string::~string((string *)(local_140 + 8));
      goto LAB_002ac463;
    }
    local_98.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_98.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmGeneratorExpression::cmGeneratorExpression(local_118,&local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_98.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_140,(char *)local_118);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    local_138._M_string_length = 0;
    local_138.field_2._M_local_buf[0] = '\0';
    cmCompiledGeneratorExpression::Evaluate
              ((cmCompiledGeneratorExpression *)local_140,this->LocalGenerator,config,false,
               (cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,(string *)(local_140 + 8));
    std::__cxx11::string::_M_assign((string *)out);
    std::__cxx11::string::~string((string *)(local_140 + 8));
    bVar5 = std::operator!=(out,pcVar7);
    if (bVar5) goto LAB_002ac441;
  }
  else {
    local_88.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_88.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmGeneratorExpression::cmGeneratorExpression(local_118,&local_88);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_88.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_140,(char *)local_118);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    local_138._M_string_length = 0;
    local_138.field_2._M_local_buf[0] = '\0';
    cmCompiledGeneratorExpression::Evaluate
              ((cmCompiledGeneratorExpression *)local_140,this->LocalGenerator,config,false,
               (cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,(string *)(local_140 + 8));
    std::__cxx11::string::_M_assign((string *)out);
    std::__cxx11::string::~string((string *)(local_140 + 8));
LAB_002ac441:
    local_f8._M_string_length = 0;
    *local_f8._M_dataplus._M_p = '\0';
  }
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)local_140);
  cmGeneratorExpression::~cmGeneratorExpression(local_118);
LAB_002ac463:
  sVar2 = out->_M_string_length;
  if (sVar2 == 0) {
    std::__cxx11::string::assign((char *)out);
  }
  in_base = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator);
  cmsys::SystemTools::CollapseFullPath((string *)(local_140 + 8),out,in_base);
  std::__cxx11::string::operator=((string *)out,(string *)(local_140 + 8));
  std::__cxx11::string::~string((string *)(local_140 + 8));
  if (local_f8._M_string_length != 0) {
    iVar6 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x29])
                      (this->GlobalGenerator,this->Makefile);
    pcVar7 = "${EFFECTIVE_PLATFORM_NAME}";
    if ((char)iVar6 == '\0') {
      pcVar7 = "";
    }
    if (sVar2 != 0) {
      pcVar7 = "";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_140 + 8),pcVar7,(allocator<char> *)local_118);
    pcVar3 = this->LocalGenerator->GlobalGenerator;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_118,"/",(allocator<char> *)local_140);
    (*pcVar3->_vptr_cmGlobalGenerator[0x16])(pcVar3,local_118,&local_f8,local_140 + 8,out);
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::string::~string((string *)(local_140 + 8));
  }
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)&local_f8);
  return sVar2 == 0;
}

Assistant:

bool cmGeneratorTarget::ComputeOutputDir(const std::string& config,
                                         cmStateEnums::ArtifactType artifact,
                                         std::string& out) const
{
  bool usesDefaultOutputDir = false;
  std::string conf = config;

  // Look for a target property defining the target output directory
  // based on the target type.
  std::string targetTypeName = this->GetOutputTargetType(artifact);
  const char* propertyName = nullptr;
  std::string propertyNameStr = targetTypeName;
  if (!propertyNameStr.empty()) {
    propertyNameStr += "_OUTPUT_DIRECTORY";
    propertyName = propertyNameStr.c_str();
  }

  // Check for a per-configuration output directory target property.
  std::string configUpper = cmSystemTools::UpperCase(conf);
  const char* configProp = nullptr;
  std::string configPropStr = targetTypeName;
  if (!configPropStr.empty()) {
    configPropStr += "_OUTPUT_DIRECTORY_";
    configPropStr += configUpper;
    configProp = configPropStr.c_str();
  }

  // Select an output directory.
  if (const char* config_outdir = this->GetProperty(configProp)) {
    // Use the user-specified per-configuration output directory.
    cmGeneratorExpression ge;
    std::unique_ptr<cmCompiledGeneratorExpression> cge =
      ge.Parse(config_outdir);
    out = cge->Evaluate(this->LocalGenerator, config);

    // Skip per-configuration subdirectory.
    conf.clear();
  } else if (const char* outdir = this->GetProperty(propertyName)) {
    // Use the user-specified output directory.
    cmGeneratorExpression ge;
    std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(outdir);
    out = cge->Evaluate(this->LocalGenerator, config);

    // Skip per-configuration subdirectory if the value contained a
    // generator expression.
    if (out != outdir) {
      conf.clear();
    }
  } else if (this->GetType() == cmStateEnums::EXECUTABLE) {
    // Lookup the output path for executables.
    out = this->Makefile->GetSafeDefinition("EXECUTABLE_OUTPUT_PATH");
  } else if (this->GetType() == cmStateEnums::STATIC_LIBRARY ||
             this->GetType() == cmStateEnums::SHARED_LIBRARY ||
             this->GetType() == cmStateEnums::MODULE_LIBRARY) {
    // Lookup the output path for libraries.
    out = this->Makefile->GetSafeDefinition("LIBRARY_OUTPUT_PATH");
  }
  if (out.empty()) {
    // Default to the current output directory.
    usesDefaultOutputDir = true;
    out = ".";
  }

  // Convert the output path to a full path in case it is
  // specified as a relative path.  Treat a relative path as
  // relative to the current output directory for this makefile.
  out = (cmSystemTools::CollapseFullPath(
    out, this->LocalGenerator->GetCurrentBinaryDirectory()));

  // The generator may add the configuration's subdirectory.
  if (!conf.empty()) {
    bool useEPN =
      this->GlobalGenerator->UseEffectivePlatformName(this->Makefile);
    std::string suffix =
      usesDefaultOutputDir && useEPN ? "${EFFECTIVE_PLATFORM_NAME}" : "";
    this->LocalGenerator->GetGlobalGenerator()->AppendDirectoryForConfig(
      "/", conf, suffix, out);
  }

  return usesDefaultOutputDir;
}